

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O1

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path **_path,xr_reader *r)

{
  way_point_vec *this_00;
  ushort uVar1;
  ushort *puVar2;
  pointer pwVar3;
  uint16_t *puVar4;
  float *pfVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  way_path *value;
  size_t sVar7;
  uint index;
  _Alloc_hider _Var8;
  ulong uVar9;
  uint16_t version;
  ushort local_6a;
  way_point local_68;
  
  value = (way_path *)operator_new(0x50);
  (value->name)._M_dataplus._M_p = (pointer)&(value->name).field_2;
  (value->name)._M_string_length = 0;
  (value->name).field_2._M_local_buf[0] = '\0';
  (value->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_path = value;
  sVar7 = xr_reader::r_raw_chunk(r,1,&local_6a,2);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3a,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  if ((local_6a & 0xfffe) != 0x12) {
    __assert_fail("version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3b,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  sVar7 = xr_reader::find_chunk(r,2);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x3e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  this_00 = &value->points;
  if (local_6a == 0x12) {
    puVar2 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar1 = *puVar2;
    std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::reserve
              (this_00,(ulong)uVar1);
    if ((ulong)uVar1 != 0) {
      index = 0;
      paVar6 = &local_68.name.field_2;
      do {
        local_68.name.field_2._8_8_ = 0;
        local_68.position.field_0._0_8_ = 0;
        local_68._40_8_ = 0;
        local_68.name._M_string_length = 0;
        local_68.name.field_2._M_allocated_capacity = 0;
        local_68.name._M_dataplus._M_p = (pointer)paVar6;
        std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::
        emplace_back<xray_re::way_point>(this_00,&local_68);
        _Var8._M_p = local_68.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.name._M_dataplus._M_p != paVar6) {
          operator_delete(local_68.name._M_dataplus._M_p,
                          local_68.name.field_2._M_allocated_capacity + 1);
        }
        way_point_io_12::operator()
                  ((way_point_io_12 *)_Var8._M_p,
                   (value->points).
                   super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,r,index);
        index = index + 1;
      } while (uVar1 != index);
    }
  }
  else {
    if (local_6a != 0x13) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                    ,0x4e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
    }
    puVar2 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar9 = (ulong)*puVar2;
    std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::reserve(this_00,uVar9);
    if (uVar9 != 0) {
      paVar6 = &local_68.name.field_2;
      do {
        local_68.name.field_2._8_8_ = 0;
        local_68.position.field_0._0_8_ = 0;
        local_68._40_8_ = 0;
        local_68.name._M_string_length = 0;
        local_68.name.field_2._M_allocated_capacity = 0;
        local_68.name._M_dataplus._M_p = (pointer)paVar6;
        std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::
        emplace_back<xray_re::way_point>(this_00,&local_68);
        _Var8._M_p = local_68.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.name._M_dataplus._M_p != paVar6) {
          operator_delete(local_68.name._M_dataplus._M_p,
                          local_68.name.field_2._M_allocated_capacity + 1);
        }
        uVar9 = uVar9 - 1;
        way_point_io::operator()
                  ((way_point_io *)_Var8._M_p,
                   (value->points).
                   super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1,r);
      } while (uVar9 != 0);
    }
  }
  sVar7 = xr_reader::find_chunk(r,3);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,0x54,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  if (local_6a == 0x12) {
    puVar2 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar9 = (ulong)*puVar2;
    std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::reserve(&value->links,uVar9)
    ;
    if (uVar9 != 0) {
      do {
        local_68.name._M_dataplus._M_p = (pointer)0x0;
        std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::
        emplace_back<xray_re::way_link>(&value->links,(way_link *)&local_68);
        pwVar3 = (value->links).
                 super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
        pwVar3[-1].from = *puVar4;
        puVar4 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
        pwVar3[-1].to = *puVar4;
        pwVar3[-1].weight = 1.0;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    if (local_6a != 0x13) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                    ,0x5e,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
    }
    puVar2 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar9 = (ulong)*puVar2;
    std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::reserve(&value->links,uVar9)
    ;
    if (uVar9 != 0) {
      do {
        local_68.name._M_dataplus._M_p = (pointer)0x0;
        std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::
        emplace_back<xray_re::way_link>(&value->links,(way_link *)&local_68);
        pwVar3 = (value->links).
                 super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
        pwVar3[-1].from = *puVar4;
        puVar4 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
        pwVar3[-1].to = *puVar4;
        pfVar5 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
        pwVar3[-1].weight = *pfVar5;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  sVar7 = xr_reader::find_chunk(r,5);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                  ,100,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
  }
  xr_reader::r_sz(r,(string *)value);
  return;
}

Assistant:

void way_path_io::operator()(way_path*& _path, xr_reader& r) const
{
	way_path* path = new way_path;
	_path = path;
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->points, way_point_io());
		break;
	case WAYOBJECT_VERSION_12: {
		int n = r.r_u16();
		path->points.reserve(n);
		for (int i = 0; i != n; i++) {
			path->points.push_back(way_point());
			way_point_io_12()(path->points.back(), r, i);
		}
		}
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->links, way_link_io());
		break;
	case WAYOBJECT_VERSION_12:
		r.r_seq(r.r_u16(), path->links, way_link_io_12());
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_NAME))
		xr_not_expected();
	r.r_sz(path->name);
	r.debug_find_chunk();
}